

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ad,realtype droptol,int sparsetype)

{
  long *plVar1;
  long M;
  long N;
  void *pvVar2;
  void *pvVar3;
  SUNMatrix_ID SVar4;
  SUNMatrix p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (droptol < 0.0 || 1 < (uint)sparsetype) {
    return (SUNMatrix)0x0;
  }
  SVar4 = SUNMatGetID(Ad);
  if (SVar4 == SUNMATRIX_BAND) {
    plVar1 = (long *)Ad->content;
    M = *plVar1;
    N = plVar1[1];
    lVar9 = 0;
    if (0 < N) {
      lVar9 = N;
    }
    lVar8 = 0;
    lVar6 = 0;
    for (lVar10 = 0; lVar10 != lVar9; lVar10 = lVar10 + 1) {
      lVar11 = lVar10 - plVar1[3];
      if (lVar10 - plVar1[3] < 1) {
        lVar11 = 0;
      }
      lVar12 = plVar1[4] + lVar10;
      if (M <= plVar1[4] + lVar10) {
        lVar12 = M + -1;
      }
      for (; lVar11 <= lVar12; lVar11 = lVar11 + 1) {
        lVar6 = lVar6 + (ulong)(droptol <
                               ABS(*(double *)
                                    (plVar1[5] * 8 + *(long *)(plVar1[8] + lVar10 * 8) + lVar8 +
                                    lVar11 * 8)));
      }
      lVar8 = lVar8 + -8;
    }
    p_Var5 = SUNSparseMatrix(M,N,lVar6,sparsetype);
    if (p_Var5 != (SUNMatrix)0x0) {
      if (sparsetype == 0) {
        lVar8 = 0;
        lVar6 = 0;
        for (lVar10 = 0; lVar11 = N, lVar10 != lVar9; lVar10 = lVar10 + 1) {
          pvVar2 = p_Var5->content;
          *(long *)(*(long *)((long)pvVar2 + 0x38) + lVar10 * 8) = lVar6;
          pvVar3 = Ad->content;
          lVar11 = lVar10 - *(long *)((long)pvVar3 + 0x18);
          if (lVar11 < 1) {
            lVar11 = 0;
          }
          lVar12 = lVar11 + lVar8;
          while( true ) {
            lVar7 = *(long *)((long)pvVar3 + 0x20) + lVar10;
            if (M <= lVar7) {
              lVar7 = M + -1;
            }
            if (lVar7 < lVar11) break;
            lVar7 = *(long *)(*(long *)((long)pvVar3 + 0x40) + lVar10 * 8);
            if (droptol < ABS(*(double *)(*(long *)((long)pvVar3 + 0x28) * 8 + lVar7 + lVar12 * 8)))
            {
              *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar6 * 8) = lVar11;
              *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar6 * 8) =
                   *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) * 8 + lVar7 + lVar12 * 8);
              lVar6 = lVar6 + 1;
            }
            lVar11 = lVar11 + 1;
            lVar12 = lVar12 + 1;
          }
          lVar8 = lVar8 + -1;
        }
      }
      else {
        lVar9 = 0;
        if (0 < M) {
          lVar9 = M;
        }
        lVar8 = 0;
        lVar6 = 0;
        for (lVar10 = 0; lVar11 = M, lVar10 != lVar9; lVar10 = lVar10 + 1) {
          pvVar2 = p_Var5->content;
          *(long *)(*(long *)((long)pvVar2 + 0x38) + lVar10 * 8) = lVar6;
          pvVar3 = Ad->content;
          lVar11 = lVar10 - *(long *)((long)pvVar3 + 0x20);
          if (lVar11 < 1) {
            lVar11 = 0;
          }
          lVar12 = lVar8 + lVar11 * -8;
          while( true ) {
            lVar7 = *(long *)((long)pvVar3 + 0x18) + lVar10;
            if (N <= lVar7) {
              lVar7 = N + -1;
            }
            if (lVar7 < lVar11) break;
            lVar7 = *(long *)(*(long *)((long)pvVar3 + 0x40) + lVar11 * 8);
            if (droptol < ABS(*(double *)(lVar12 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar7))) {
              *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar6 * 8) = lVar11;
              *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar6 * 8) =
                   *(undefined8 *)(lVar12 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar7);
              lVar6 = lVar6 + 1;
            }
            lVar11 = lVar11 + 1;
            lVar12 = lVar12 + -8;
          }
          lVar8 = lVar8 + 8;
        }
      }
      *(long *)(*(long *)((long)p_Var5->content + 0x38) + lVar11 * 8) = lVar6;
      return p_Var5;
    }
  }
  return (SUNMatrix)0x0;
}

Assistant:

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ad, realtype droptol, int sparsetype)
{
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  /* check for legal sparsetype, droptol and input matrix type */
  if ( (sparsetype != CSR_MAT) && (sparsetype != CSC_MAT) )
    return NULL;
  if ( droptol < ZERO )
    return NULL;
  if (SUNMatGetID(Ad) != SUNMATRIX_BAND)
    return NULL;
  
  /* set size of new matrix */
  M = SM_ROWS_B(Ad);
  N = SM_COLUMNS_B(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j=0; j<N; j++)
    for (i=SUNMAX(0,j-SM_UBAND_B(Ad)); i<=SUNMIN(M-1,j+SM_LBAND_B(Ad)); i++)
      nnz += (SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol);

  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype);
  if (As == NULL)  return NULL;

  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT) {
    for (j=0; j<N; j++) {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i=SUNMAX(0,j-SM_UBAND_B(Ad)); i<=SUNMIN(M-1,j+SM_LBAND_B(Ad)); i++) {
        if ( SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_B(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  } else {       /* CSR_MAT */
    for (i=0; i<M; i++) {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j=SUNMAX(0,i-SM_LBAND_B(Ad)); j<=SUNMIN(N-1,i+SM_UBAND_B(Ad)); j++) {
        if ( SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_B(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return(As);
}